

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::BasicNonMS<tcu::Vector<float,_4>,_4>::Run
          (BasicNonMS<tcu::Vector<float,_4>,_4> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  void *__s;
  long lVar2;
  GLenum target;
  value_type_conflict5 *__val;
  ImageSizeMachine machine;
  ivec4 iStack_a8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  target = 0xde1;
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture[0]);
  lVar2 = 0;
  do {
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(this_00,target,10,0x8814,0x200,0x80);
    glu::CallLogWrapper::glBindImageTexture(this_00,1,this->m_texture[lVar2],1,'\0',0,35000,0x8814);
    lVar1 = lVar2 + 1;
    target = *(GLenum *)(&DAT_01a96b44 + lVar2 * 4);
    glu::CallLogWrapper::glBindTexture(this_00,target,this->m_texture[lVar2 + 1]);
    lVar2 = lVar1;
  } while (lVar1 != 6);
  __s = operator_new(0x100);
  memset(__s,0,0x100);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x100,__s,0x88e4);
  glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer);
  glu::CallLogWrapper::glBindImageTexture(this_00,7,this->m_texture[6],0,'\0',0,35000,0x8814);
  operator_delete(__s,0x100);
  ImageSizeMachine::ImageSizeMachine(&machine);
  iStack_a8.m_data[0] = 0x100;
  iStack_a8.m_data[1] = 0x40;
  iStack_a8.m_data[2] = 0;
  iStack_a8.m_data[3] = 0;
  uStack_98 = 0x800000008;
  uStack_90 = 4;
  uStack_88 = 0x1000000010;
  uStack_80 = 0;
  uStack_78 = 0x200000002;
  uStack_70 = 2;
  uStack_68 = 0x800000010;
  uStack_60 = 0;
  uStack_58 = 0x90000001f;
  uStack_50 = 0xc;
  uStack_48 = 0x10;
  uStack_40 = 0;
  lVar2 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<float,4>>
                    ((ImageSizeMachine *)&machine,4,false,&iStack_a8,false);
  ImageSizeMachine::~ImageSizeMachine(&machine);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D,		 GL_TEXTURE_3D,
								   GL_TEXTURE_CUBE_MAP,  GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 4, 4, 12);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexStorage2D(target[i], 1, TexInternalFormat<T>(), 16, 8);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(6, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				std::vector<GLubyte> data(256);
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 256, &data[0], GL_STATIC_DRAW);
				glTexBuffer(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0),   ivec4(16, 16, 0, 0), ivec4(2, 2, 2, 0),
						 ivec4(16, 8, 0, 0),   ivec4(31, 9, 12, 0), ivec4(16, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res);
	}